

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recursive_inotify_poller.cc
# Opt level: O2

bool __thiscall RecursiveInotifyPoller::AddWatch(RecursiveInotifyPoller *this,string *path)

{
  int iVar1;
  DIR *__dirp;
  dirent *pdVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar1 = (*this->ip_->_vptr_InotifyPoller[2])();
  if (SUB41(iVar1,0) != false) {
    __dirp = opendir((path->_M_dataplus)._M_p);
    if (__dirp != (DIR *)0x0) {
      while( true ) {
        pdVar2 = readdir(__dirp);
        if (pdVar2 == (dirent *)0x0) break;
        if ((pdVar2->d_type == '\x04') &&
           ((pdVar2->d_name[0] != '.' ||
            ((pdVar2->d_name[1] != '\0' &&
             ((pdVar2->d_name[1] != '.' || (pdVar2->d_name[2] != '\0')))))))) {
          std::operator+(&local_70,path,pdVar2->d_name);
          std::operator+(&local_50,&local_70,'/');
          (*(this->super_InotifyPoller)._vptr_InotifyPoller[2])(this,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_70);
        }
      }
      closedir(__dirp);
    }
  }
  return SUB41(iVar1,0);
}

Assistant:

bool RecursiveInotifyPoller::AddWatch(const std::string& path) {
  // Add the path itself.
  if (!ip_->AddWatch(path))
    return false;

  // Recursive add all of its children.
  DIR* d = opendir(path.c_str());
  if (d != nullptr) {
    struct dirent* de;
    while ((de = readdir(d)) != nullptr) {
      if (de->d_type == DT_DIR && strcmp(de->d_name, ".") != 0 &&
          strcmp(de->d_name, "..") != 0)
        AddWatch(path + de->d_name + '/');
    }
    closedir(d);
  }
  return true;
}